

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O0

REF_STATUS ref_grid_orient_edg(REF_GRID ref_grid,REF_INT *nodes)

{
  uint uVar1;
  undefined8 in_stack_fffffffffffffde8;
  undefined4 uVar3;
  undefined8 uVar2;
  uint local_1fc;
  uint local_1f4;
  uint local_1f0;
  uint local_1e8;
  uint local_1e4;
  uint local_1dc;
  uint local_1d8;
  uint local_1d0;
  uint local_1cc;
  uint local_1c4;
  uint local_1c0;
  uint local_1b8;
  uint local_1b4;
  uint local_1ac;
  uint local_1a8;
  uint local_1a0;
  uint local_19c;
  uint local_194;
  uint local_190;
  uint local_188;
  uint local_184;
  uint local_17c;
  uint local_178;
  uint local_170;
  uint local_16c;
  uint local_164;
  uint local_160;
  uint local_158;
  uint local_154;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT node1;
  REF_INT node0;
  REF_INT qua_nodes [27];
  uint local_a4;
  REF_INT tri_nodes [27];
  REF_INT local_30;
  uint local_2c;
  REF_INT edg_qua;
  REF_INT nqua;
  REF_INT edg_tri;
  REF_INT ntri;
  REF_INT *nodes_local;
  REF_GRID ref_grid_local;
  
  uVar3 = (undefined4)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  _edg_tri = (uint *)nodes;
  nodes_local = (REF_INT *)ref_grid;
  uVar1 = ref_cell_list_with2(ref_grid->cell[3],*nodes,nodes[1],1,&nqua,&edg_qua);
  if (uVar1 == 0) {
    uVar1 = ref_cell_list_with2(*(REF_CELL *)(nodes_local + 0x10),*_edg_tri,_edg_tri[1],1,
                                (REF_INT *)&local_2c,&local_30);
    if (uVar1 == 0) {
      if ((long)(int)(nqua + local_2c) == 1) {
        if (nqua < (int)local_2c) {
          local_154 = nqua;
        }
        else {
          local_154 = local_2c;
        }
        if ((long)(int)local_154 == 0) {
          ref_private_macro_code_rss = -1;
          ref_private_macro_code_rss_1 = -1;
          if (nqua == 1) {
            uVar1 = ref_cell_nodes(*(REF_CELL *)(nodes_local + 10),edg_qua,qua_nodes + 0x1a);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,0x47c,"ref_grid_orient_edg",(ulong)uVar1,"tri nodes");
              return uVar1;
            }
            if ((int)*_edg_tri < (int)_edg_tri[1]) {
              local_158 = *_edg_tri;
            }
            else {
              local_158 = _edg_tri[1];
            }
            if (qua_nodes[0x1a] < (int)local_a4) {
              local_160 = qua_nodes[0x1a];
            }
            else {
              local_160 = local_a4;
            }
            if (local_158 == local_160) {
              if ((int)_edg_tri[1] < (int)*_edg_tri) {
                local_164 = *_edg_tri;
              }
              else {
                local_164 = _edg_tri[1];
              }
              if ((int)local_a4 < qua_nodes[0x1a]) {
                local_16c = qua_nodes[0x1a];
              }
              else {
                local_16c = local_a4;
              }
              if (local_164 == local_16c) {
                ref_private_macro_code_rss = qua_nodes[0x1a];
                ref_private_macro_code_rss_1 = local_a4;
              }
            }
            if ((int)*_edg_tri < (int)_edg_tri[1]) {
              local_170 = *_edg_tri;
            }
            else {
              local_170 = _edg_tri[1];
            }
            if ((int)local_a4 < tri_nodes[0]) {
              local_178 = local_a4;
            }
            else {
              local_178 = tri_nodes[0];
            }
            if (local_170 == local_178) {
              if ((int)_edg_tri[1] < (int)*_edg_tri) {
                local_17c = *_edg_tri;
              }
              else {
                local_17c = _edg_tri[1];
              }
              if (tri_nodes[0] < (int)local_a4) {
                local_184 = local_a4;
              }
              else {
                local_184 = tri_nodes[0];
              }
              if (local_17c == local_184) {
                ref_private_macro_code_rss = local_a4;
                ref_private_macro_code_rss_1 = tri_nodes[0];
              }
            }
            if ((int)*_edg_tri < (int)_edg_tri[1]) {
              local_188 = *_edg_tri;
            }
            else {
              local_188 = _edg_tri[1];
            }
            if (tri_nodes[0] < qua_nodes[0x1a]) {
              local_190 = tri_nodes[0];
            }
            else {
              local_190 = qua_nodes[0x1a];
            }
            if (local_188 == local_190) {
              if ((int)_edg_tri[1] < (int)*_edg_tri) {
                local_194 = *_edg_tri;
              }
              else {
                local_194 = _edg_tri[1];
              }
              if (qua_nodes[0x1a] < tri_nodes[0]) {
                local_19c = tri_nodes[0];
              }
              else {
                local_19c = qua_nodes[0x1a];
              }
              if (local_194 == local_19c) {
                ref_private_macro_code_rss = tri_nodes[0];
                ref_private_macro_code_rss_1 = qua_nodes[0x1a];
              }
            }
          }
          if (local_2c == 1) {
            uVar1 = ref_cell_nodes(*(REF_CELL *)(nodes_local + 0x10),local_30,&node1);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,0x48f,"ref_grid_orient_edg",(ulong)uVar1,"qua nodes");
              return uVar1;
            }
            if ((int)*_edg_tri < (int)_edg_tri[1]) {
              local_1a0 = *_edg_tri;
            }
            else {
              local_1a0 = _edg_tri[1];
            }
            if (node1 < node0) {
              local_1a8 = node1;
            }
            else {
              local_1a8 = node0;
            }
            if (local_1a0 == local_1a8) {
              if ((int)_edg_tri[1] < (int)*_edg_tri) {
                local_1ac = *_edg_tri;
              }
              else {
                local_1ac = _edg_tri[1];
              }
              if (node0 < node1) {
                local_1b4 = node1;
              }
              else {
                local_1b4 = node0;
              }
              if (local_1ac == local_1b4) {
                ref_private_macro_code_rss = node1;
                ref_private_macro_code_rss_1 = node0;
              }
            }
            if ((int)*_edg_tri < (int)_edg_tri[1]) {
              local_1b8 = *_edg_tri;
            }
            else {
              local_1b8 = _edg_tri[1];
            }
            if (node0 < qua_nodes[0]) {
              local_1c0 = node0;
            }
            else {
              local_1c0 = qua_nodes[0];
            }
            if (local_1b8 == local_1c0) {
              if ((int)_edg_tri[1] < (int)*_edg_tri) {
                local_1c4 = *_edg_tri;
              }
              else {
                local_1c4 = _edg_tri[1];
              }
              if (qua_nodes[0] < node0) {
                local_1cc = node0;
              }
              else {
                local_1cc = qua_nodes[0];
              }
              if (local_1c4 == local_1cc) {
                ref_private_macro_code_rss = node0;
                ref_private_macro_code_rss_1 = qua_nodes[0];
              }
            }
            if ((int)*_edg_tri < (int)_edg_tri[1]) {
              local_1d0 = *_edg_tri;
            }
            else {
              local_1d0 = _edg_tri[1];
            }
            if (qua_nodes[0] < qua_nodes[1]) {
              local_1d8 = qua_nodes[0];
            }
            else {
              local_1d8 = qua_nodes[1];
            }
            if (local_1d0 == local_1d8) {
              if ((int)_edg_tri[1] < (int)*_edg_tri) {
                local_1dc = *_edg_tri;
              }
              else {
                local_1dc = _edg_tri[1];
              }
              if (qua_nodes[1] < qua_nodes[0]) {
                local_1e4 = qua_nodes[0];
              }
              else {
                local_1e4 = qua_nodes[1];
              }
              if (local_1dc == local_1e4) {
                ref_private_macro_code_rss = qua_nodes[0];
                ref_private_macro_code_rss_1 = qua_nodes[1];
              }
            }
            if ((int)*_edg_tri < (int)_edg_tri[1]) {
              local_1e8 = *_edg_tri;
            }
            else {
              local_1e8 = _edg_tri[1];
            }
            if (qua_nodes[1] < node1) {
              local_1f0 = qua_nodes[1];
            }
            else {
              local_1f0 = node1;
            }
            if (local_1e8 == local_1f0) {
              if ((int)_edg_tri[1] < (int)*_edg_tri) {
                local_1f4 = *_edg_tri;
              }
              else {
                local_1f4 = _edg_tri[1];
              }
              if (node1 < qua_nodes[1]) {
                local_1fc = qua_nodes[1];
              }
              else {
                local_1fc = node1;
              }
              if (local_1f4 == local_1fc) {
                ref_private_macro_code_rss = qua_nodes[1];
                ref_private_macro_code_rss_1 = node1;
              }
            }
          }
          if (ref_private_macro_code_rss == -1) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x4ab,"ref_grid_orient_edg","node0 not found");
            uVar2 = CONCAT44(uVar3,0xffffffff);
            printf("nodes %d %d %d ntri %d nqua %d node0 %d node1 %d\n",(ulong)*_edg_tri,
                   (ulong)_edg_tri[1],(ulong)_edg_tri[2],(ulong)(uint)nqua,(ulong)local_2c,uVar2,
                   ref_private_macro_code_rss_1);
            if (0 < (int)local_2c) {
              printf("qua %d %d %d %d %d\n",(ulong)(uint)node1,(ulong)(uint)node0,
                     (ulong)(uint)qua_nodes[0],(ulong)(uint)qua_nodes[1],(ulong)(uint)qua_nodes[2],
                     uVar2,ref_private_macro_code_rss_1);
            }
            ref_grid_local._4_4_ = 1;
          }
          else if (ref_private_macro_code_rss_1 == -1) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x4ac,"ref_grid_orient_edg","node1 not found");
            ref_grid_local._4_4_ = 1;
          }
          else {
            *_edg_tri = ref_private_macro_code_rss;
            _edg_tri[1] = ref_private_macro_code_rss_1;
            ref_grid_local._4_4_ = 0;
          }
        }
        else {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x477,"ref_grid_orient_edg","expect zero min tri/qua for an edge",0,
                 (long)(int)local_154);
          ref_grid_local._4_4_ = 1;
        }
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               0x476,"ref_grid_orient_edg","expect one tri/qua for an edge",1,
               (long)(int)(nqua + local_2c));
        ref_grid_local._4_4_ = 1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x475,
             "ref_grid_orient_edg",(ulong)uVar1,"qua with edge side");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x472,
           "ref_grid_orient_edg",(ulong)uVar1,"tri with edge side");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_grid_orient_edg(REF_GRID ref_grid, REF_INT *nodes) {
  REF_INT ntri, edg_tri, nqua, edg_qua;
  REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT qua_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node0, node1;
  RSS(ref_cell_list_with2(ref_grid_tri(ref_grid), nodes[0], nodes[1], 1, &ntri,
                          &edg_tri),
      "tri with edge side");
  RSS(ref_cell_list_with2(ref_grid_qua(ref_grid), nodes[0], nodes[1], 1, &nqua,
                          &edg_qua),
      "qua with edge side");
  REIS(1, ntri + nqua, "expect one tri/qua for an edge");
  REIS(0, MIN(ntri, nqua), "expect zero min tri/qua for an edge");
  node0 = REF_EMPTY;
  node1 = REF_EMPTY;
  if (1 == ntri) {
    RSS(ref_cell_nodes(ref_grid_tri(ref_grid), edg_tri, tri_nodes),
        "tri nodes");
    if ((MIN(nodes[0], nodes[1]) == MIN(tri_nodes[0], tri_nodes[1])) &&
        (MAX(nodes[0], nodes[1]) == MAX(tri_nodes[0], tri_nodes[1]))) {
      node0 = tri_nodes[0];
      node1 = tri_nodes[1];
    }
    if ((MIN(nodes[0], nodes[1]) == MIN(tri_nodes[1], tri_nodes[2])) &&
        (MAX(nodes[0], nodes[1]) == MAX(tri_nodes[1], tri_nodes[2]))) {
      node0 = tri_nodes[1];
      node1 = tri_nodes[2];
    }
    if ((MIN(nodes[0], nodes[1]) == MIN(tri_nodes[2], tri_nodes[0])) &&
        (MAX(nodes[0], nodes[1]) == MAX(tri_nodes[2], tri_nodes[0]))) {
      node0 = tri_nodes[2];
      node1 = tri_nodes[0];
    }
  }
  if (1 == nqua) {
    RSS(ref_cell_nodes(ref_grid_qua(ref_grid), edg_qua, qua_nodes),
        "qua nodes");
    if ((MIN(nodes[0], nodes[1]) == MIN(qua_nodes[0], qua_nodes[1])) &&
        (MAX(nodes[0], nodes[1]) == MAX(qua_nodes[0], qua_nodes[1]))) {
      node0 = qua_nodes[0];
      node1 = qua_nodes[1];
    }
    if ((MIN(nodes[0], nodes[1]) == MIN(qua_nodes[1], qua_nodes[2])) &&
        (MAX(nodes[0], nodes[1]) == MAX(qua_nodes[1], qua_nodes[2]))) {
      node0 = qua_nodes[1];
      node1 = qua_nodes[2];
    }
    if ((MIN(nodes[0], nodes[1]) == MIN(qua_nodes[2], qua_nodes[3])) &&
        (MAX(nodes[0], nodes[1]) == MAX(qua_nodes[2], qua_nodes[3]))) {
      node0 = qua_nodes[2];
      node1 = qua_nodes[3];
    }
    if ((MIN(nodes[0], nodes[1]) == MIN(qua_nodes[3], qua_nodes[0])) &&
        (MAX(nodes[0], nodes[1]) == MAX(qua_nodes[3], qua_nodes[0]))) {
      node0 = qua_nodes[3];
      node1 = qua_nodes[0];
    }
  }
  RUB(REF_EMPTY, node0, "node0 not found", {
    printf("nodes %d %d %d ntri %d nqua %d node0 %d node1 %d\n", nodes[0],
           nodes[1], nodes[2], ntri, nqua, node0, node1);
    if (nqua > 0)
      printf("qua %d %d %d %d %d\n", qua_nodes[0], qua_nodes[1], qua_nodes[2],
             qua_nodes[3], qua_nodes[4]);
  });
  RUS(REF_EMPTY, node1, "node1 not found");
  /* same direction as triangle or quad side */
  nodes[0] = node0;
  nodes[1] = node1;

  return REF_SUCCESS;
}